

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

void sat_solver2_reducedb(sat_solver2 *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  word *pwVar3;
  uint nSize;
  uint uVar4;
  int **ppiVar5;
  int *piVar6;
  int *piVar7;
  Prf_Man_t *pPVar8;
  Vec_Wrd_t *pVVar9;
  Vec_Int_t *pVVar10;
  word *pwVar11;
  cla *pcVar12;
  veci *pvVar13;
  int iVar14;
  int *pCosts;
  int *piVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  uint *puVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  double dVar32;
  timespec ts;
  timespec local_58;
  long local_48;
  ulong local_40;
  int **local_38;
  
  nSize = (s->act_clas).size;
  piVar15 = (s->act_clas).ptr;
  iVar14 = clock_gettime(3,&local_58);
  if (iVar14 < 0) {
    local_48 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
    local_48 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_58.tv_sec * -1000000;
  }
  sat_solver2_reducedb::Count = sat_solver2_reducedb::Count + 1;
  if (s->nLearntMax == 0) {
    __assert_fail("s->nLearntMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x58b,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  iVar14 = s->nDBreduces + 1;
  s->nDBreduces = iVar14;
  iVar28 = iVar14 * s->nLearntDelta + s->nLearntStart;
  s->nLearntMax = iVar28;
  iVar14 = s->nLearntRatio;
  pCosts = (int *)malloc((long)(int)nSize * 4);
  iVar18 = (s->Mem).iPage[1];
  if (iVar18 < 1) {
    puVar27 = (uint *)0x0;
  }
  else {
    ppiVar5 = (s->Mem).pPages;
    lVar17 = 1;
    puVar27 = (uint *)0x0;
    do {
      piVar6 = ppiVar5[lVar17];
      if (2 < *piVar6) {
        piVar7 = (s->Mem).pPages[lVar17];
        if (piVar7 == (int *)0x0) {
          puVar27 = (uint *)0x0;
        }
        else {
          uVar20 = 2;
          do {
            puVar27 = (uint *)(piVar7 + uVar20);
            uVar22 = *puVar27 >> 3 & 0xff;
            if (6 < uVar22) {
              uVar22 = 7;
            }
            uVar31 = piVar15[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]] >> 4;
            pCosts[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]] = (uVar22 ^ 7) << 0x1c | uVar31;
            if ((int)uVar31 < 0) {
              __assert_fail("pSortValues[Id] >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x5ab,"void sat_solver2_reducedb(sat_solver2 *)");
            }
            uVar20 = uVar20 + ((*puVar27 & 1) + (*puVar27 >> 0xb) + 2 & 0xfffffffe);
          } while ((int)uVar20 < *piVar6);
        }
      }
      lVar17 = lVar17 + 2;
    } while ((int)lVar17 <= iVar18);
  }
  piVar15 = Abc_MergeSortCost(pCosts,nSize);
  if (pCosts[piVar15[(long)(int)nSize + -1]] < pCosts[*piVar15]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x5af,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  iVar18 = (int)((ulong)((long)iVar28 * -0x66666667) >> 0x20);
  iVar28 = ((iVar18 >> 3) - (iVar18 >> 0x1f)) + nSize;
  iVar14 = (int)((ulong)((long)(int)(iVar14 * nSize) * -0x51eb851f) >> 0x20);
  iVar14 = pCosts[piVar15[(int)(((iVar14 >> 5) - (iVar14 >> 0x1f)) + nSize)]];
  free(piVar15);
  iVar18 = (s->Mem).iPage[1];
  if (iVar18 < 1) {
    iVar19 = 0;
  }
  else {
    local_38 = (s->Mem).pPages;
    uVar30 = 0;
    lVar17 = 1;
    iVar23 = 0;
    do {
      uVar25 = uVar30;
      iVar19 = iVar23;
      if (2 < *local_38[lVar17]) {
        piVar15 = (s->Mem).pPages[lVar17];
        uVar20 = 2;
        do {
          local_40 = uVar30;
          if (piVar15 == (int *)0x0) {
            puVar27 = (uint *)0x0;
            uVar25 = uVar30;
            iVar19 = iVar23;
            break;
          }
          puVar27 = (uint *)(piVar15 + uVar20);
          uVar22 = *puVar27;
          if ((uVar22 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5b8,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          iVar24 = (int)uVar25;
          if (((iVar24 <= iVar28) && (0xfff < uVar22)) &&
             (pCosts[(int)puVar27[(ulong)(uVar22 >> 0xb) + 1]] < iVar14)) {
            iVar19 = iVar19 + (uint)(s->reasons[(int)puVar27[1] >> 1] !=
                                    ((int)lVar17 << ((byte)(s->Mem).nPageSize & 0x1f) | uVar20));
          }
          if ((int)nSize / 6 <= iVar19) {
            uVar25 = (ulong)(iVar24 + 1);
            break;
          }
          uVar20 = uVar20 + ((uVar22 >> 0xb) + (uVar22 & 1) + 2 & 0xfffffffe);
          uVar25 = (ulong)(iVar24 + 1);
        } while ((int)uVar20 < *local_38[lVar17]);
      }
      uVar30 = uVar25;
      lVar17 = lVar17 + 2;
      iVar23 = iVar19;
    } while ((int)lVar17 <= iVar18);
  }
  if (iVar19 < (int)nSize / 6) {
    if (pCosts != (int *)0x0) {
      free(pCosts);
    }
  }
  else {
    uVar20 = 0;
    if ((s->claProofs).size == 0) {
      piVar15 = (int *)0x0;
    }
    else {
      piVar15 = (s->claProofs).ptr;
    }
    if ((s->Mem).iPage[1] < 1) {
      uVar22 = 0;
    }
    else {
      uVar22 = 0;
      lVar17 = 1;
      uVar20 = 0;
      do {
        if (2 < *(s->Mem).pPages[lVar17]) {
          uVar30 = 2;
          do {
            piVar6 = (s->Mem).pPages[lVar17];
            if (piVar6 == (int *)0x0) {
              puVar27 = (uint *)0x0;
              break;
            }
            puVar27 = (uint *)(piVar6 + uVar30);
            uVar31 = *puVar27;
            if ((uVar31 & 2) != 0) {
              __assert_fail("c->mark == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x5cc,"void sat_solver2_reducedb(sat_solver2 *)");
            }
            if (((iVar28 < (int)uVar22) || (uVar31 < 0x1000)) ||
               ((iVar14 <= pCosts[(int)puVar27[(ulong)(uVar31 >> 0xb) + 1]] ||
                (s->reasons[(int)puVar27[1] >> 1] ==
                 ((int)lVar17 << ((byte)(s->Mem).nPageSize & 0x1f) | (uint)uVar30))))) {
              pCosts[(int)uVar20] = pCosts[(int)puVar27[(ulong)(uVar31 >> 0xb) + 1]];
              if (piVar15 != (int *)0x0) {
                piVar15[(int)uVar20] = piVar15[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]];
              }
              pPVar8 = s->pPrf2;
              if (pPVar8 != (Prf_Man_t *)0x0) {
                if (pPVar8->iFirst < 0) {
                  __assert_fail("p->iFirst >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                ,0xb1,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                }
                uVar31 = puVar27[(ulong)(*puVar27 >> 0xb) + 1];
                if (pPVar8->iFirst <= (int)uVar31) {
                  if (pPVar8->vSaved->nSize == 0) {
                    if (pPVar8->iFirst2 != -1) {
                      __assert_fail("p->iFirst2 == -1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                    ,0xb6,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                    }
                    pPVar8->iFirst2 = uVar20;
                  }
                  Vec_IntPush(pPVar8->vSaved,uVar31);
                }
              }
              uVar20 = uVar20 + 1;
            }
            else {
              *puVar27 = uVar31 | 2;
              pAVar1 = &(s->stats).learnts_literals;
              *pAVar1 = *pAVar1 - (ulong)(uVar31 >> 0xb);
              puVar2 = &(s->stats).learnts;
              *puVar2 = *puVar2 - 1;
            }
            uVar31 = (uint)uVar30 + ((*puVar27 & 1) + (*puVar27 >> 0xb) + 2 & 0xfffffffe);
            uVar30 = (ulong)uVar31;
            uVar22 = uVar22 + 1;
          } while ((int)uVar31 < *(s->Mem).pPages[lVar17]);
        }
        lVar17 = lVar17 + 2;
      } while ((int)lVar17 <= (s->Mem).iPage[1]);
    }
    if (pCosts != (int *)0x0) {
      free(pCosts);
    }
    pPVar8 = s->pPrf2;
    if (pPVar8 != (Prf_Man_t *)0x0) {
      iVar14 = pPVar8->iFirst;
      if (iVar14 < 0) {
        __assert_fail("p->iFirst >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xbe,"void Prf_ManCompact(Prf_Man_t *, int)");
      }
      if (pPVar8->pInfo != (word *)0x0) {
        __assert_fail("p->pInfo == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xbf,"void Prf_ManCompact(Prf_Man_t *, int)");
      }
      pVVar9 = pPVar8->vInfo;
      uVar31 = pVVar9->nSize;
      uVar4 = pPVar8->nWords;
      pVVar10 = pPVar8->vSaved;
      iVar18 = pVVar10->nSize;
      if ((long)iVar18 < 1) {
        uVar26 = 0;
      }
      else {
        piVar15 = pVVar10->pArray;
        lVar17 = 0;
        uVar26 = 0;
        do {
          iVar28 = piVar15[lVar17] - iVar14;
          if ((iVar28 < 0) || ((int)uVar31 / (int)uVar4 <= iVar28)) {
            __assert_fail("Entry - p->iFirst >= 0 && Entry - p->iFirst < nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0xc3,"void Prf_ManCompact(Prf_Man_t *, int)");
          }
          uVar29 = iVar28 * uVar4;
          if (((int)uVar29 < 0) || ((int)uVar31 <= (int)uVar29)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pwVar11 = pVVar9->pArray;
          pwVar3 = pwVar11 + uVar29;
          pPVar8->pInfo = pwVar3;
          if (0 < (int)uVar4) {
            if ((int)uVar26 < 0) {
LAB_004f20f1:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
            }
            uVar29 = uVar31;
            if ((int)uVar31 < (int)uVar26) {
              uVar29 = uVar26;
            }
            uVar30 = 0;
            do {
              if (uVar29 - uVar26 == uVar30) goto LAB_004f20f1;
              pwVar11[uVar26 + uVar30] = pwVar3[uVar30];
              uVar30 = uVar30 + 1;
            } while (uVar4 != uVar30);
            uVar26 = uVar26 + (int)uVar30;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar18);
      }
      if ((int)uVar31 < (int)uVar26) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
      }
      pVVar9->nSize = uVar26;
      pVVar10->nSize = 0;
      pPVar8->pInfo = (word *)0x0;
      uVar31 = pPVar8->iFirst2;
      if (pPVar8->iFirst2 == 0xffffffff) {
        uVar31 = uVar20;
      }
      pPVar8->iFirst = uVar31;
      pPVar8->iFirst2 = -1;
    }
    if ((s->stats).learnts != uVar20) {
      __assert_fail("s->stats.learnts == (unsigned)j",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5e3,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if (uVar22 != nSize) {
      __assert_fail("Counter == nLearnedOld",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5e4,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if ((s->act_clas).size < (int)uVar20) {
LAB_004f21ab:
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->act_clas).size = uVar20;
    iVar14 = (s->claProofs).size;
    if (iVar14 != 0) {
      if (iVar14 < (int)uVar20) goto LAB_004f21ab;
      (s->claProofs).size = uVar20;
    }
    uVar20 = Sat_MemCompactLearned(&s->Mem,0);
    if (uVar20 != (s->stats).learnts) {
      __assert_fail("Counter == (int)s->stats.learnts",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5eb,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if (0 < s->size) {
      pcVar12 = s->reasons;
      lVar17 = 0;
      do {
        uVar20 = pcVar12[lVar17];
        if (((uVar20 & 1) == 0 && uVar20 != 0) && (((s->Mem).uLearnedMask & uVar20) != 0)) {
          if ((*puVar27 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5f6,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          uVar22 = (s->Mem).uPageMask & uVar20;
          if (uVar22 == 0) goto LAB_004f216d;
          piVar15 = (s->Mem).pPages[(int)uVar20 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar20 = piVar15[(int)uVar22];
          if ((uVar20 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5f8,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          puVar27 = (uint *)(piVar15 + (int)uVar22);
          pcVar12[lVar17] = puVar27[(ulong)(uVar20 >> 0xb) + 1];
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < s->size);
    }
    if (0 < s->size) {
      pvVar13 = s->wlists;
      lVar17 = 0;
      do {
        iVar14 = pvVar13[lVar17].size;
        if (iVar14 < 1) {
          iVar18 = 0;
        }
        else {
          piVar15 = pvVar13[lVar17].ptr;
          lVar21 = 0;
          iVar18 = 0;
          do {
            uVar20 = piVar15[lVar21];
            if (((uVar20 & 1) == 0) && (((s->Mem).uLearnedMask & uVar20) != 0)) {
              if ((*puVar27 & 1) == 0) {
                __assert_fail("c->lrn",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x608,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              if (uVar20 == 0) {
                puVar27 = (uint *)0x0;
              }
              else {
                uVar22 = (s->Mem).uPageMask & uVar20;
                if (uVar22 == 0) goto LAB_004f216d;
                puVar27 = (uint *)((s->Mem).pPages[(int)uVar20 >> ((byte)(s->Mem).nPageSize & 0x1f)]
                                  + (int)uVar22);
              }
              if ((*puVar27 & 2) == 0) {
                uVar20 = puVar27[(ulong)(*puVar27 >> 0xb) + 1];
                goto LAB_004f1efa;
              }
            }
            else {
LAB_004f1efa:
              lVar16 = (long)iVar18;
              iVar18 = iVar18 + 1;
              piVar15[lVar16] = uVar20;
            }
            lVar21 = lVar21 + 1;
            iVar14 = pvVar13[lVar17].size;
          } while (lVar21 < iVar14);
        }
        if (iVar14 < iVar18) goto LAB_004f21ab;
        pvVar13[lVar17].size = iVar18;
        lVar17 = lVar17 + 1;
      } while (SBORROW8(lVar17,(long)s->size * 2) != lVar17 + (long)s->size * -2 < 0);
    }
    if ((s->fProofLogging != 0) && (0 < s->size)) {
      pcVar12 = s->units;
      lVar17 = 0;
      do {
        uVar20 = pcVar12[lVar17];
        if ((uVar20 != 0) && (((s->Mem).uLearnedMask & uVar20) != 0)) {
          if ((*puVar27 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x616,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          uVar22 = (s->Mem).uPageMask & uVar20;
          if (uVar22 == 0) {
LAB_004f216d:
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                          ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          piVar15 = (s->Mem).pPages[(int)uVar20 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar20 = piVar15[(int)uVar22];
          if ((uVar20 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x618,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          puVar27 = (uint *)(piVar15 + (int)uVar22);
          pcVar12[lVar17] = puVar27[(ulong)(uVar20 >> 0xb) + 1];
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < s->size);
    }
    uVar20 = Sat_MemCompactLearned(&s->Mem,1);
    lVar17 = local_48;
    if (uVar20 != (s->stats).learnts) {
      __assert_fail("Counter == (int)s->stats.learnts",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x61e,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      iVar14 = Sat_ProofReduce(s->pPrf1,&s->claProofs,s->hProofPivot);
      s->hProofPivot = iVar14;
    }
    iVar18 = 3;
    iVar14 = clock_gettime(3,&local_58);
    if (iVar14 < 0) {
      lVar21 = -1;
    }
    else {
      lVar21 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    sat_solver2_reducedb::TimeTotal = sat_solver2_reducedb::TimeTotal + lVar21 + lVar17;
    if (s->fVerbose != 0) {
      uVar30 = (ulong)(s->stats).learnts;
      Abc_Print(iVar18,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                ((double)uVar30 * 100.0) / (double)(int)nSize,uVar30,(ulong)nSize);
      dVar32 = (double)sat_solver2_reducedb::TimeTotal;
      Abc_Print(iVar18,"%s =","Time");
      Abc_Print(iVar18,"%9.2f sec\n",dVar32 / 1000000.0);
    }
  }
  return;
}

Assistant:

void sat_solver2_reducedb(sat_solver2* s)
{
    static abctime TimeTotal = 0;
    Sat_Mem_t * pMem = &s->Mem;
    clause * c = NULL;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pSortValues, nCutoffValue, * pClaProofs;
    int i, j, k, Id, nSelected;//, LastSize = 0;
    int Counter, CounterStart;
    abctime clk = Abc_Clock();
    static int Count = 0;
    Count++;
    assert( s->nLearntMax );
    s->nDBreduces++;
//    printf( "Calling reduceDB with %d clause limit and parameters (%d %d %d).\n", s->nLearntMax, s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

/*
    // find the new limit
    s->nLearntMax = s->nLearntMax * 11 / 10;
    // preserve 1/10 of last clauses
    CounterStart  = s->stats.learnts - (s->nLearntMax / 10);
    // preserve 1/10 of most active clauses
    pSortValues = veci_begin(&s->act_clas);
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld*9/10]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;
*/


    // find the new limit
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);
    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;
    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
        pSortValues[Id] = (((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4));
//        pSortValues[Id] = act_clas[Id];
        assert( pSortValues[Id] >= 0 );
    }
    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;

    // count how many clauses satisfy the condition
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
        }
        else
            j++;
        if ( j >= nLearnedOld / 6 )
            break;
    }
    if ( j < nLearnedOld / 6 )
    {
        ABC_FREE( pSortValues );
        return;
    }

    // mark learned clauses to remove
    Counter = j = 0;
    pClaProofs = veci_size(&s->claProofs) ? veci_begin(&s->claProofs) : NULL;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
            pSortValues[j] = pSortValues[clause_id(c)];
            if ( pClaProofs ) 
                pClaProofs[j] = pClaProofs[clause_id(c)];
            if ( s->pPrf2 )
                Prf_ManAddSaved( s->pPrf2, clause_id(c), j );
            j++;
        }
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    ABC_FREE( pSortValues );
    if ( s->pPrf2 )
        Prf_ManCompact( s->pPrf2, j );
//    if ( j == nLearnedOld )
//        return;

    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    if ( veci_size(&s->claProofs) )
        veci_resize(&s->claProofs,j);

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        assert( c->lrn );
        c = clause2_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                assert( c->lrn );
                c = clause2_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // compact units
    if ( s->fProofLogging )
        for ( i = 0; i < s->size; i++ )
            if ( s->units[i] && clause_learnt_h(pMem, s->units[i]) )
            {
                assert( c->lrn );
                c = clause2_read( s, s->units[i] );
                assert( c->mark == 0 );
                s->units[i] = clause_id(c);
            }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // compact proof (compacts 'proofs' and update 'claProofs')
    if ( s->pPrf1 )
    {
        extern int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot );
        s->hProofPivot = Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
        Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
            s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
}